

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_addLinearObjective
                   (void *highs,double weight,double offset,double *coefficients,
                   double abs_tolerance,double rel_tolerance,HighsInt priority)

{
  HighsInt iObj;
  HighsStatus HVar1;
  HighsInt iCol;
  HighsInt num_col;
  HighsLinearObjective linear_objective;
  int iVar2;
  undefined4 in_stack_ffffffffffffff74;
  Highs *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  HighsInt HVar3;
  
  HighsLinearObjective::HighsLinearObjective((HighsLinearObjective *)0x437350);
  iObj = Highs_getNumCol((void *)0x43735d);
  HVar3 = iObj;
  for (iVar2 = 0; iVar2 < HVar3; iVar2 = iVar2 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)CONCAT44(HVar3,in_stack_ffffffffffffff80),
               (value_type_conflict1 *)in_stack_ffffffffffffff78);
  }
  HVar1 = Highs::addLinearObjective
                    (in_stack_ffffffffffffff78,
                     (HighsLinearObjective *)CONCAT44(in_stack_ffffffffffffff74,iVar2),iObj);
  HighsLinearObjective::~HighsLinearObjective((HighsLinearObjective *)0x437433);
  return HVar1;
}

Assistant:

HighsInt Highs_addLinearObjective(const void* highs, const double weight,
                                  const double offset,
                                  const double* coefficients,
                                  const double abs_tolerance,
                                  const double rel_tolerance,
                                  const HighsInt priority) {
  HighsLinearObjective linear_objective;
  HighsInt num_col = Highs_getNumCol(highs);
  linear_objective.weight = weight;
  linear_objective.offset = offset;
  for (HighsInt iCol = 0; iCol < num_col; iCol++)
    linear_objective.coefficients.push_back(coefficients[iCol]);
  linear_objective.abs_tolerance = abs_tolerance;
  linear_objective.rel_tolerance = rel_tolerance;
  linear_objective.priority = priority;
  linear_objective.weight = weight;
  return HighsInt(((Highs*)highs)->addLinearObjective(linear_objective));
}